

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node expr_operand_name(Parser *psr)

{
  uint64_t name_00;
  _Bool _Var1;
  Node NVar2;
  uint64_t name;
  Parser *psr_local;
  Node result;
  
  name_00 = (psr->lxr).tk.field_4.ident_hash;
  lex_next(&psr->lxr);
  _Var1 = expr_operand_local(psr,(Node *)&psr_local,name_00);
  if (!_Var1) {
    psr_trigger_err(psr,"variable not defined");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                  ,0x4a2,"Node expr_operand_name(Parser *)");
  }
  NVar2._4_4_ = 0;
  NVar2.type = (uint)psr_local;
  NVar2.field_1 = (anon_union_8_6_f630ca3c_for_Node_1)result._0_8_;
  return NVar2;
}

Assistant:

static Node expr_operand_name(Parser *psr) {
	// Save the identifier's name and skip over the token
	Node result;
	uint64_t name = psr->lxr.tk.ident_hash;
	lex_next(&psr->lxr);

	// Check local variables in the current scope
	if (expr_operand_local(psr, &result, name)) {
		return result;
	}

	// Failed to resolve the name to some symbol
	psr_trigger_err(psr, "variable not defined");
	UNREACHABLE();
}